

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O1

bool google::protobuf::internal::anon_unknown_0::GetEnumValidationRange
               (EnumDescriptor *enum_type,int16_t *start,uint16_t *size)

{
  uint16_t *puVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  EnumValueDescriptor *pEVar5;
  ulong uVar6;
  string *psVar7;
  undefined8 extraout_RAX;
  ulong uVar8;
  int index;
  uint16_t *puVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  bool bVar15;
  unsigned_long local_140 [32];
  size_type local_40;
  unsigned_long *local_38;
  
  iVar13 = enum_type->value_count_;
  puVar9 = (uint16_t *)(long)iVar13;
  if (iVar13 + -1 == (int)enum_type->sequential_value_limit_) {
    if (iVar13 < 1) {
LAB_0028fc3b:
      psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (0,(long)puVar9,"index < value_count()");
    }
    else {
      psVar7 = (string *)0x0;
    }
    if (psVar7 != (string *)0x0) {
      _GLOBAL__N_1::GetEnumValidationRange();
LAB_0028fc6e:
      _GLOBAL__N_1::GetEnumValidationRange();
      if (0x20 < local_40) {
        operator_delete(local_38,local_40 << 3);
      }
      _Unwind_Resume(extraout_RAX);
    }
    iVar13 = enum_type->values_->number_;
    uVar2 = enum_type->value_count_;
    bVar15 = (iVar13 + 0x8000U | uVar2) < 0x10000;
    if (bVar15) {
      *start = (uint16_t)iVar13;
      *size = (uint16_t)uVar2;
    }
  }
  else {
    if (iVar13 < 1) {
      psVar7 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (0,(long)puVar9,"index < value_count()");
    }
    else {
      psVar7 = (string *)0x0;
    }
    if (psVar7 != (string *)0x0) goto LAB_0028fc6e;
    iVar13 = enum_type->values_->number_;
    iVar3 = enum_type->value_count_;
    iVar12 = iVar13;
    if (1 < iVar3) {
      index = 1;
      do {
        pEVar5 = EnumDescriptor::value(enum_type,index);
        if (pEVar5->number_ < iVar13) {
          iVar13 = pEVar5->number_;
        }
        pEVar5 = EnumDescriptor::value(enum_type,index);
        iVar4 = pEVar5->number_;
        if (pEVar5->number_ < iVar12) {
          iVar4 = iVar12;
        }
        iVar12 = iVar4;
        index = index + 1;
      } while (iVar3 != index);
    }
    lVar10 = (long)iVar12 - (long)iVar13;
    if (lVar10 < enum_type->value_count_) {
      bVar15 = false;
      if (((short)iVar13 == iVar13) &&
         (puVar1 = (uint16_t *)(lVar10 + 1), bVar15 = false, puVar1 < (uint16_t *)0x10000)) {
        *start = (short)iVar13;
        lVar11 = lVar10 + 0x7f;
        if (-1 < lVar10 + 0x40) {
          lVar11 = lVar10 + 0x40;
        }
        *size = (uint16_t)puVar1;
        local_40 = lVar11 >> 6;
        if (local_40 < 0x21) {
          local_38 = local_140;
        }
        else {
          local_38 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                               ((new_allocator<unsigned_long> *)&local_40,local_40,(void *)0x0);
        }
        if (local_40 != 0) {
          memset(local_38,0,local_40 << 3);
        }
        uVar2 = enum_type->value_count_;
        start = (int16_t *)0x0;
        if (0 < (int)uVar2) {
          size = (uint16_t *)start;
          start = (int16_t *)(uint16_t *)0x0;
          do {
            puVar9 = size;
            pEVar5 = EnumDescriptor::value(enum_type,(int)size);
            uVar6 = (long)pEVar5->number_ - (long)iVar13;
            uVar8 = uVar6 >> 6;
            if (local_40 <= uVar8) {
              _GLOBAL__N_1::GetEnumValidationRange();
              goto LAB_0028fc3b;
            }
            start = (int16_t *)
                    (ulong)(((int)start + 1) - (uint)((local_38[uVar8] >> (uVar6 & 0x3f) & 1) != 0))
            ;
            local_38[uVar8] = local_38[uVar8] | 1L << (uVar6 & 0x3f);
            uVar14 = (int)size + 1;
            size = (uint16_t *)(ulong)uVar14;
          } while (uVar2 != uVar14);
        }
        bVar15 = puVar1 == (uint16_t *)start;
        if (0x20 < local_40) {
          operator_delete(local_38,local_40 << 3);
        }
      }
    }
    else {
      bVar15 = false;
    }
  }
  return bVar15;
}

Assistant:

bool GetEnumValidationRange(const EnumDescriptor* enum_type, int16_t& start,
                            uint16_t& size) {
  if (!IsEnumFullySequential(enum_type)) {
    // Maybe the labels are not sequential in declaration order, but the values
    // could still be a dense range. Try the slower approach.
    return GetEnumValidationRangeSlow(enum_type, start, size);
  }

  return SetEnumValidationRange(enum_type->value(0)->number(),
                                enum_type->value_count(), start, size);
}